

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

bool __thiscall libtorrent::aux::torrent::is_finished(torrent *this)

{
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> this_00;
  bool bVar1;
  bool bVar2;
  
  bVar1 = is_seed(this);
  bVar2 = true;
  if (!bVar1) {
    if ((0 < (((this->super_torrent_hot_members).m_torrent_file.
               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_files).m_piece_length) &&
       (this_00._M_head_impl =
             (this->super_torrent_hot_members).m_picker._M_t.
             super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             ._M_t.
             super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
             .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
       this_00._M_head_impl != (piece_picker *)0x0)) {
      bVar1 = piece_picker::is_finished(this_00._M_head_impl);
      return bVar1;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool torrent::is_finished() const
	{
		if (is_seed()) return true;
		return valid_metadata() && has_picker() && m_picker->is_finished();
	}